

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O2

ostream * L13_4::operator<<(ostream *os,Banana *b)

{
  operator<<(os,&b->super_Fruit);
  std::operator<<(os,"Style: ");
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Banana &b) {
        os << (const Fruit &) b;
        os << "Style: " << b._style << std::endl;
        return os;
    }